

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void cfd::UtxoUtil::ConvertToUtxo(UtxoData *utxo_data,Utxo *utxo,UtxoData *dest)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Script SVar3;
  Script SVar4;
  undefined1 auVar5 [56];
  byte bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 *puVar12;
  uchar *puVar13;
  ulong uVar14;
  size_type sVar15;
  void *__dest;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset;
  Script *scriptsig_template;
  uint32_t txin_size;
  uint32_t wit_size;
  AddressType addr_type;
  DescriptorScriptReference *script_ref;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ref_list;
  Descriptor desc;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  elements_prefixes;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> addr_prefixes;
  NetType net_type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> locking_script_bytes;
  ByteData txid;
  ByteData block_hash;
  UtxoData output;
  UtxoData *in_stack_fffffffffffff358;
  UtxoData *in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff368;
  undefined4 in_stack_fffffffffffff36c;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *in_stack_fffffffffffff370;
  undefined4 in_stack_fffffffffffff378;
  undefined4 in_stack_fffffffffffff37c;
  undefined4 in_stack_fffffffffffff380;
  undefined4 in_stack_fffffffffffff384;
  pointer in_stack_fffffffffffff388;
  undefined1 in_stack_fffffffffffff394 [16];
  undefined4 in_stack_fffffffffffff3a4;
  AddressType AVar16;
  undefined4 in_stack_fffffffffffff3b0;
  undefined8 *puVar17;
  undefined5 in_stack_fffffffffffff3c0;
  undefined1 uVar18;
  UtxoData *in_stack_fffffffffffff3c8;
  undefined7 in_stack_fffffffffffff3d0;
  byte in_stack_fffffffffffff3d7;
  long in_stack_fffffffffffff3d8;
  uint in_stack_fffffffffffff3e0;
  uint *in_stack_fffffffffffff3e8;
  uint in_stack_fffffffffffff3f0;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_fffffffffffff3f8;
  undefined4 in_stack_fffffffffffff400;
  undefined4 in_stack_fffffffffffff404;
  uint uVar19;
  Script local_b80;
  Script local_b48;
  Script local_b10;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *local_aa8;
  undefined1 local_a9c [11];
  byte local_a91;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_a90 [2];
  uint local_a60 [7];
  AddressType local_a44;
  Script local_a10;
  string local_9d8 [32];
  Script local_9b8;
  Address local_980 [424];
  Script local_7d8;
  reference local_7a0;
  vector local_798 [24];
  string local_780 [408];
  string local_5e8 [84];
  NetType local_594;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_590 [9];
  Script local_4b8;
  Script local_480;
  Address local_448 [424];
  AddressType local_2a0;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_50 [56];
  long local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  if (in_RSI != (undefined8 *)0x0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
                       in_stack_fffffffffffff3c8);
    uVar18 = SUB81(in_stack_fffffffffffff3c8,0);
    local_10[0x18] = 0;
    local_10[0x19] = 0;
    local_10[0x16] = 0;
    local_10[0x17] = 0;
    local_10[0x14] = 0;
    local_10[0x15] = 0;
    local_10[0x12] = 0;
    local_10[0x13] = 0;
    local_10[0x10] = 0;
    local_10[0x11] = 0;
    local_10[0xe] = 0;
    local_10[0xf] = 0;
    local_10[0xc] = 0;
    local_10[0xd] = 0;
    local_10[10] = 0;
    local_10[0xb] = 0;
    local_10[8] = 0;
    local_10[9] = 0;
    local_10[6] = 0;
    local_10[7] = 0;
    local_10[4] = 0;
    local_10[5] = 0;
    local_10[2] = 0;
    local_10[3] = 0;
    *local_10 = 0;
    local_10[1] = 0;
    local_10[0x1a] = 0;
    *local_10 = *local_8;
    *(undefined4 *)(local_10 + 9) = *(undefined4 *)(local_8 + 9);
    local_10[0x16] = local_8[0x4e];
    uVar11 = cfd::core::Amount::GetSatoshiValue();
    local_10[0x10] = uVar11;
    cfd::core::BlockHash::GetData();
    bVar6 = cfd::core::ByteData::Empty();
    puVar17 = local_10;
    if ((bVar6 & 1) == 0) {
      puVar12 = local_10 + 1;
      cfd::core::ByteData::GetBytes();
      puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x393564);
      *puVar12 = *(undefined8 *)puVar13;
      puVar17[2] = *(undefined8 *)(puVar13 + 8);
      puVar17[3] = *(undefined8 *)(puVar13 + 0x10);
      puVar17[4] = *(undefined8 *)(puVar13 + 0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370)
      ;
    }
    cfd::core::Txid::GetData();
    bVar6 = cfd::core::ByteData::Empty();
    puVar17 = local_10;
    if ((bVar6 & 1) == 0) {
      puVar12 = local_10 + 5;
      cfd::core::ByteData::GetBytes();
      puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x393648);
      *puVar12 = *(undefined8 *)puVar13;
      puVar17[6] = *(undefined8 *)(puVar13 + 8);
      puVar17[7] = *(undefined8 *)(puVar13 + 0x10);
      puVar17[8] = *(undefined8 *)(puVar13 + 0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370)
      ;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3936a6);
    uVar14 = std::__cxx11::string::empty();
    if ((uVar14 & 1) == 0) {
      local_594 = kMainnet;
      cfd::core::GetBitcoinAddressFormatList();
      bVar6 = cfd::core::ConfidentialAssetId::IsEmpty();
      if ((bVar6 & 1) == 0) {
        cfd::core::GetElementsAddressFormatList();
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        operator=((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                  in_stack_fffffffffffff3f8);
        local_594 = kLiquidV1;
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 *)in_stack_fffffffffffff370);
      }
      cfd::core::Address::GetAddress_abi_cxx11_();
      bVar6 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_5e8);
      if (((bVar6 ^ 0xff) & 1) != 0) {
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        clear((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )0x393800);
        core::Address::GetAddressFormatData((Address *)in_stack_fffffffffffff358);
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        push_back((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)in_stack_fffffffffffff360,(value_type *)in_stack_fffffffffffff358);
        core::AddressFormatData::~AddressFormatData((AddressFormatData *)0x393842);
        local_594 = core::Address::GetNetType((Address *)(local_8 + 0x18));
      }
      cfd::core::Descriptor::Parse(local_780,(vector *)(local_8 + 0x47));
      iVar10 = cfd::core::Descriptor::GetNeedArgumentNum();
      if (iVar10 == 0) {
        cfd::core::Descriptor::GetReferenceAll(local_798);
        local_7a0 = std::
                    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                                  *)local_798,0);
        cfd::core::DescriptorScriptReference::GetLockingScript();
        cfd::core::Script::operator=(&local_4b8,&local_7d8);
        core::Script::~Script((Script *)in_stack_fffffffffffff360);
        cfd::core::Script::GetData();
        cfd::core::ByteData::GetBytes();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff370,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff370);
        core::ByteData::~ByteData((ByteData *)0x3939b5);
        iVar10 = cfd::core::DescriptorScriptReference::GetScriptType();
        if ((iVar10 != 10) ||
           (bVar6 = cfd::core::DescriptorScriptReference::HasAddress(), (bVar6 & 1) != 0)) {
          local_2a0 = cfd::core::DescriptorScriptReference::GetAddressType();
          cfd::core::DescriptorScriptReference::GenerateAddress((NetType)local_980);
          cfd::core::Address::operator=(local_448,local_980);
          core::Address::~Address((Address *)in_stack_fffffffffffff360);
          sVar15 = std::
                   vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_798);
          std::
          vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
          ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                        *)local_798,sVar15 - 1);
          bVar6 = cfd::core::DescriptorScriptReference::HasRedeemScript();
          if ((bVar6 & 1) != 0) {
            sVar15 = std::
                     vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                             *)local_798);
            std::
            vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                          *)local_798,sVar15 - 1);
            cfd::core::DescriptorScriptReference::GetRedeemScript();
            cfd::core::Script::operator=(&local_480,&local_9b8);
            core::Script::~Script((Script *)in_stack_fffffffffffff360);
          }
        }
        *(short *)((long)local_10 + 0x76) = (short)local_2a0;
        std::
        vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ::~vector(in_stack_fffffffffffff370);
      }
      core::Descriptor::~Descriptor((Descriptor *)0x393c13);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )in_stack_fffffffffffff370);
    }
    bVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff370);
    iVar10 = (int)in_stack_fffffffffffff3d8;
    if (bVar7) {
      cfd::core::Address::GetAddress_abi_cxx11_();
      bVar6 = std::__cxx11::string::empty();
      uVar19 = (uint)bVar6 << 0x18 ^ 0xff000000;
      std::__cxx11::string::~string(local_9d8);
      iVar10 = (int)in_stack_fffffffffffff3d8;
      if ((uVar19 & 0x1000000) == 0) {
        bVar6 = cfd::core::Script::IsEmpty();
        iVar10 = (int)in_stack_fffffffffffff3d8;
        if ((bVar6 & 1) == 0) {
          cfd::core::Script::GetData();
          cfd::core::ByteData::GetBytes();
          in_stack_fffffffffffff3e8 = local_a60;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff370,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff370);
          core::ByteData::~ByteData((ByteData *)0x393e8e);
          bVar6 = cfd::core::Script::IsP2wpkhScript();
          iVar10 = (int)in_stack_fffffffffffff3d8;
          if ((bVar6 & 1) == 0) {
            bVar6 = cfd::core::Script::IsP2wshScript();
            iVar10 = (int)in_stack_fffffffffffff3d8;
            if ((bVar6 & 1) == 0) {
              bVar6 = cfd::core::Script::IsP2pkhScript();
              iVar10 = (int)in_stack_fffffffffffff3d8;
              if ((bVar6 & 1) == 0) {
                bVar6 = cfd::core::Script::IsTaprootScript();
                iVar10 = (int)in_stack_fffffffffffff3d8;
                if ((bVar6 & 1) == 0) {
                  local_a91 = 0;
                  bVar6 = cfd::core::Script::IsWitnessProgram();
                  in_stack_fffffffffffff3e0 = in_stack_fffffffffffff3e0 & 0xffffff;
                  if ((bVar6 & 1) != 0) {
                    cfd::core::Script::GetElementList();
                    local_a91 = 1;
                    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ::operator[](local_a90,0);
                    in_stack_fffffffffffff3d8 = cfd::core::ScriptElement::GetNumber();
                    in_stack_fffffffffffff3e0 =
                         CONCAT13(in_stack_fffffffffffff3d8 != 0,(int3)in_stack_fffffffffffff3e0);
                  }
                  iVar10 = (int)in_stack_fffffffffffff3d8;
                  in_stack_fffffffffffff3d7 = (byte)(in_stack_fffffffffffff3e0 >> 0x18);
                  if ((local_a91 & 1) != 0) {
                    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ::~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               *)in_stack_fffffffffffff370);
                  }
                  if ((in_stack_fffffffffffff3d7 & 1) == 0) {
                    *(undefined2 *)((long)local_10 + 0x76) = 1;
                  }
                  else {
                    *(undefined2 *)((long)local_10 + 0x76) = 8;
                  }
                }
                else {
                  *(undefined2 *)((long)local_10 + 0x76) = 7;
                }
              }
              else {
                *(undefined2 *)((long)local_10 + 0x76) = 2;
              }
            }
            else {
              *(undefined2 *)((long)local_10 + 0x76) = 3;
            }
          }
          else {
            *(undefined2 *)((long)local_10 + 0x76) = 4;
          }
          local_2a0 = (AddressType)*(ushort *)((long)local_10 + 0x76);
        }
      }
      else {
        cfd::core::Address::GetLockingScript();
        cfd::core::Script::operator=(&local_4b8,&local_a10);
        core::Script::~Script((Script *)in_stack_fffffffffffff360);
        cfd::core::Script::GetData();
        cfd::core::ByteData::GetBytes();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff370,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff370);
        core::ByteData::~ByteData((ByteData *)0x393d41);
        local_a44 = core::Address::GetAddressType(local_448);
        AVar16 = local_a44;
        if ((local_a44 == kP2shAddress) &&
           ((local_2a0 == kP2shP2wshAddress || (AVar16 = local_a44, local_2a0 == kP2shP2wpkhAddress)
            ))) {
          AVar16 = local_2a0;
        }
        local_2a0 = AVar16;
        *(short *)((long)local_10 + 0x76) = (short)local_2a0;
      }
    }
    bVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff370);
    if (!bVar7) {
      sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_590);
      *(short *)((long)local_10 + 0x74) = (short)sVar15;
      if (*(ushort *)((long)local_10 + 0x74) < 0x28) {
        __dest = (void *)((long)local_10 + 0x4c);
        puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x39412b);
        memcpy(__dest,puVar13,(ulong)*(ushort *)((long)local_10 + 0x74));
        uVar18 = SUB81(__dest,0);
      }
    }
    local_a9c._4_4_ = 0;
    local_a9c._0_4_ = 0;
    local_aa8 = (vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                 *)0x0;
    bVar6 = cfd::core::Script::IsEmpty();
    if ((bVar6 & 1) == 0) {
      local_aa8 = local_50;
    }
    bVar8 = cfd::core::ConfidentialAssetId::IsEmpty();
    if ((bVar8 & 1) == 0) {
      cfd::core::ConfidentialAssetId::GetData();
      cfd::core::ByteData::GetBytes();
      core::ByteData::~ByteData((ByteData *)0x394207);
      puVar17 = local_10;
      puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x394221);
      *(uchar *)((long)puVar17 + 0xa9) = puVar13[0x20];
      uVar11 = *(undefined8 *)puVar13;
      uVar1 = *(undefined8 *)(puVar13 + 8);
      uVar2 = *(undefined8 *)(puVar13 + 0x18);
      *(undefined8 *)((long)puVar17 + 0x99) = *(undefined8 *)(puVar13 + 0x10);
      *(undefined8 *)((long)puVar17 + 0xa1) = uVar2;
      *(undefined8 *)((long)puVar17 + 0x89) = uVar11;
      *(undefined8 *)((long)puVar17 + 0x91) = uVar1;
      bVar9 = cfd::core::ConfidentialAssetId::HasBlinding();
      *(byte *)(local_10 + 0x11) = bVar9 & 1;
      AVar16 = local_2a0;
      cfd::core::Script::Script(&local_b10,&local_480);
      cfd::core::Script::Script(&local_b48);
      in_stack_fffffffffffff360 = (UtxoData *)local_a9c;
      in_stack_fffffffffffff358 = (UtxoData *)(local_a9c + 4);
      in_stack_fffffffffffff388 = (pointer)0x0;
      in_stack_fffffffffffff380 = 0x34;
      in_stack_fffffffffffff378 = 0;
      in_stack_fffffffffffff368 = 0;
      SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff360;
      SVar3._vptr_Script = (_func_int **)in_stack_fffffffffffff358;
      SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff36c;
      SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_aa8;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff37c;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x34;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff384;
      SVar3.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auVar5._16_4_ = in_stack_fffffffffffff3a4;
      auVar5._0_16_ = in_stack_fffffffffffff394;
      auVar5._20_8_ = &stack0xfffffffffffff358;
      auVar5._28_4_ = in_stack_fffffffffffff3b0;
      auVar5._32_4_ = AVar16;
      auVar5._36_8_ = puVar17;
      auVar5._44_5_ = in_stack_fffffffffffff3c0;
      auVar5[0x31] = bVar9;
      auVar5[0x32] = bVar8;
      auVar5[0x33] = bVar6;
      auVar5._52_4_ = 0;
      in_stack_fffffffffffff370 = local_aa8;
      cfd::core::ConfidentialTxIn::EstimateTxInSize
                (AVar16,SVar3,(uint)&local_b10,(Script)(auVar5 << 0x20),false,SUB81(&local_b48,0),
                 (uint *)0x0,(uint *)0x0,(bool)uVar18,
                 (Script *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),iVar10,
                 in_stack_fffffffffffff3e0,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3f0);
      core::Script::~Script((Script *)in_stack_fffffffffffff360);
      core::Script::~Script((Script *)in_stack_fffffffffffff360);
      local_a9c._0_4_ = local_a9c._0_4_ + -0x29;
      *(short *)(local_10 + 0xf) = (short)local_a9c._4_4_;
      *(short *)((long)local_10 + 0x7a) = (short)local_a9c._0_4_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370)
      ;
    }
    if ((local_a9c._4_4_ == 0) && (local_a9c._0_4_ == 0)) {
      local_a9c._4_4_ = 0;
      local_a9c._0_4_ = 0;
      AVar16 = local_2a0;
      cfd::core::Script::Script(&local_b80,&local_480);
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff360;
      SVar4._vptr_Script = (_func_int **)in_stack_fffffffffffff358;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff368;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff36c;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff370;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff378;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff37c;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff380;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff384;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff388;
      cfd::core::TxIn::EstimateTxInSize
                (AVar16,SVar4,(uint *)&local_b80,(uint *)(local_a9c + 4),(Script *)local_a9c);
      core::Script::~Script((Script *)in_stack_fffffffffffff360);
      local_a9c._0_4_ = local_a9c._0_4_ + -0x29;
      *(short *)(local_10 + 0xf) = (short)local_a9c._4_4_;
      *(short *)((long)local_10 + 0x7a) = (short)local_a9c._0_4_;
    }
    if (local_18 != 0) {
      UtxoData::operator=(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370);
    core::ByteData::~ByteData((ByteData *)0x394541);
    core::ByteData::~ByteData((ByteData *)0x39454e);
    UtxoData::~UtxoData(in_stack_fffffffffffff360);
  }
  return;
}

Assistant:

void UtxoUtil::ConvertToUtxo(
    const UtxoData& utxo_data, Utxo* utxo, UtxoData* dest) {
  if (utxo != nullptr) {
    UtxoData output(utxo_data);
    memset(utxo, 0, sizeof(Utxo));
    utxo->block_height = utxo_data.block_height;
    utxo->vout = utxo_data.vout;
    utxo->binary_data = utxo_data.binary_data;
    utxo->amount = utxo_data.amount.GetSatoshiValue();

    ByteData block_hash = utxo_data.block_hash.GetData();
    if (!block_hash.Empty()) {
      memcpy(
          utxo->block_hash, block_hash.GetBytes().data(),
          sizeof(utxo->block_hash));
    }
    ByteData txid = utxo_data.txid.GetData();
    if (!txid.Empty()) {
      memcpy(utxo->txid, txid.GetBytes().data(), sizeof(utxo->txid));
    }

    // convert from descriptor
    std::vector<uint8_t> locking_script_bytes;
    if (!utxo_data.descriptor.empty()) {
      NetType net_type = NetType::kMainnet;
      std::vector<AddressFormatData> addr_prefixes =
          cfd::core::GetBitcoinAddressFormatList();
#ifndef CFD_DISABLE_ELEMENTS
      if (!utxo_data.asset.IsEmpty()) {
        std::vector<AddressFormatData> elements_prefixes =
            cfd::core::GetElementsAddressFormatList();
        addr_prefixes = elements_prefixes;
        net_type = NetType::kLiquidV1;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (!utxo_data.address.GetAddress().empty()) {
        addr_prefixes.clear();
        addr_prefixes.push_back(utxo_data.address.GetAddressFormatData());
        net_type = utxo_data.address.GetNetType();
      }

      Descriptor desc =
          Descriptor::Parse(utxo_data.descriptor, &addr_prefixes);
      if (desc.GetNeedArgumentNum() == 0) {
        std::vector<DescriptorScriptReference> ref_list =
            desc.GetReferenceAll();
        DescriptorScriptReference& script_ref = ref_list[0];
        output.locking_script = script_ref.GetLockingScript();
        locking_script_bytes = output.locking_script.GetData().GetBytes();
        if ((script_ref.GetScriptType() !=
             DescriptorScriptType::kDescriptorScriptRaw) ||
            script_ref.HasAddress()) {
          output.address_type = script_ref.GetAddressType();
          output.address = script_ref.GenerateAddress(net_type);
          if (ref_list[ref_list.size() - 1].HasRedeemScript()) {
            output.redeem_script =
                ref_list[ref_list.size() - 1].GetRedeemScript();
          }
        }
        utxo->address_type = static_cast<uint16_t>(output.address_type);
      }
    }

    if (!locking_script_bytes.empty()) {
      // do nothing
    } else if (!output.address.GetAddress().empty()) {
      output.locking_script = output.address.GetLockingScript();
      locking_script_bytes = output.locking_script.GetData().GetBytes();
      AddressType addr_type = output.address.GetAddressType();
      if ((addr_type == AddressType::kP2shAddress) &&
          ((output.address_type == AddressType::kP2shP2wshAddress) ||
           (output.address_type == AddressType::kP2shP2wpkhAddress))) {
        // direct set. output.address_type;
      } else {
        output.address_type = addr_type;
      }
      utxo->address_type = static_cast<uint16_t>(output.address_type);
    } else if (!utxo_data.locking_script.IsEmpty()) {
      locking_script_bytes = utxo_data.locking_script.GetData().GetBytes();
      if (utxo_data.locking_script.IsP2wpkhScript()) {
        utxo->address_type = AddressType::kP2wpkhAddress;
      } else if (utxo_data.locking_script.IsP2wshScript()) {
        utxo->address_type = AddressType::kP2wshAddress;
      } else if (utxo_data.locking_script.IsP2pkhScript()) {
        utxo->address_type = AddressType::kP2pkhAddress;
      } else if (utxo_data.locking_script.IsTaprootScript()) {
        utxo->address_type = AddressType::kTaprootAddress;
      } else if (
          utxo_data.locking_script.IsWitnessProgram() &&
          (utxo_data.locking_script.GetElementList()[0].GetNumber() != 0)) {
        utxo->address_type = AddressType::kWitnessUnknown;
      } else {  // TODO(k-matsuzawa): unbknown type is convert to p2sh
        utxo->address_type = AddressType::kP2shAddress;
      }
      output.address_type = static_cast<AddressType>(utxo->address_type);
    }

    if (!locking_script_bytes.empty()) {
      utxo->script_length = static_cast<uint16_t>(locking_script_bytes.size());
      if (utxo->script_length < sizeof(utxo->locking_script)) {
        memcpy(
            utxo->locking_script, locking_script_bytes.data(),
            utxo->script_length);
      }
    }

    uint32_t wit_size = 0;
    uint32_t txin_size = 0;
    const Script* scriptsig_template = nullptr;
    if (!output.scriptsig_template.IsEmpty()) {
      scriptsig_template = &output.scriptsig_template;
    }

#ifndef CFD_DISABLE_ELEMENTS
    if (!utxo_data.asset.IsEmpty()) {
      std::vector<uint8_t> asset = utxo_data.asset.GetData().GetBytes();
      memcpy(utxo->asset, asset.data(), sizeof(utxo->asset));
      utxo->blinded = utxo_data.asset.HasBlinding();

      ConfidentialTxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, 0, Script(), false, false,
          &wit_size, &txin_size, false, scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }
#endif  // CFD_DISABLE_ELEMENTS

    if ((wit_size == 0) && (txin_size == 0)) {
      wit_size = 0;
      txin_size = 0;
      TxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, &wit_size, &txin_size,
          scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }

    if (dest != nullptr) {
      *dest = output;
    }
  }
}